

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

bool __thiscall
kainjow::mustache::
component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::is_newline(component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             *this)

{
  wchar_t wVar1;
  size_type sVar2;
  pointer pwVar3;
  
  if ((this->tag).type == text) {
    sVar2 = (this->text)._M_string_length;
    if (sVar2 == 1) {
      wVar1 = *(this->text)._M_dataplus._M_p;
      return wVar1 == L'\r' || wVar1 == L'\n';
    }
    if (((sVar2 == 2) && (pwVar3 = (this->text)._M_dataplus._M_p, *pwVar3 == L'\r')) &&
       (pwVar3[1] == L'\n')) {
      return true;
    }
  }
  return false;
}

Assistant:

bool is_text() const {
        return tag.type == tag_type::text;
    }